

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMoveSrEa<(moira::Instr)75,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *this_00;
  Ea<(moira::Mode)2,_2> dst;
  u32 local_2c;
  ushort local_28;
  
  local_28 = op & 7;
  local_2c = *addr;
  SVar1 = str->style->syntax;
  this_00 = StrWriter::operator<<(str);
  if (SVar1 != MUSASHI) {
    this_00 = StrWriter::operator<<(this_00);
  }
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00);
  StrWriter::operator<<(this_00);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)2,_2> *)&local_2c);
  return;
}

Assistant:

void
Moira::dasmMoveSrEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Op<M, S>( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Sr{} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Sr{} << Sep{} << dst;
    }
}